

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_bst.h
# Opt level: O2

int * __thiscall
CP::map_bst<int,_int,_std::less<int>_>::operator[]
          (map_bst<int,_int,_std::less<int>_> *this,int *key)

{
  uint uVar1;
  node *pnVar2;
  ValueT VVar3;
  map_bst<int,_int,_std::less<int>_> *pmVar4;
  node *parent;
  
  parent = (node *)0x0;
  pnVar2 = find_node(this,key,this->mRoot,&parent);
  if (pnVar2 == (node *)0x0) {
    pnVar2 = (node *)operator_new(0x20);
    uVar1 = *key;
    VVar3.second = 0;
    VVar3.first = uVar1;
    pnVar2->data = VVar3;
    pnVar2->left = (node *)0x0;
    pnVar2->right = (node *)0x0;
    pnVar2->parent = parent;
    pmVar4 = this;
    if (parent != (node *)0x0) {
      pmVar4 = (map_bst<int,_int,_std::less<int>_> *)
               (&parent->left + ((parent->data).first <= (int)uVar1));
    }
    pmVar4->mRoot = pnVar2;
    this->mSize = this->mSize + 1;
  }
  return &(pnVar2->data).second;
}

Assistant:

MappedT& operator[](const KeyT& key) {
      node *parent = NULL;
      node *ptr = find_node(key, mRoot, parent);
      if (ptr == NULL) {
        ptr = new node(std::make_pair(key,MappedT()),NULL,NULL,parent);
        child_link(parent, key) = ptr;
        mSize++;
      }
      return ptr->data.second;
    }